

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O0

QByteArray * __thiscall
QNetworkHeadersPrivate::rawHeader(QNetworkHeadersPrivate *this,QAnyStringView headerName)

{
  QLatin1StringView str;
  QByteArrayView a;
  int iVar1;
  const_pointer pvVar2;
  qsizetype qVar3;
  QAnyStringView *in_RCX;
  QAnyStringView *in_RDX;
  char *in_RSI;
  QAnyStringView *in_RDI;
  long in_FS_OFFSET;
  qsizetype i;
  char *separator;
  QByteArray *result;
  QByteArrayView setCookieStr;
  QHttpHeaders *in_stack_fffffffffffffef8;
  qsizetype in_stack_ffffffffffffff00;
  QByteArray *this_00;
  QAnyStringView *this_01;
  QHttpHeaders *this_02;
  QAnyStringView in_stack_ffffffffffffff40;
  QByteArray *local_b0;
  QAnyStringView *local_68;
  QAnyStringView *local_60;
  QHttpHeaders local_48 [2];
  QAnyStringView *local_38;
  QAnyStringView *local_30;
  QByteArrayView local_28;
  QAnyStringView *local_18;
  QAnyStringView *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.m_data = (storage_type *)0xaaaaaaaaaaaaaaaa;
  local_28.m_size = 0xaaaaaaaaaaaaaaaa;
  this_01 = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RCX;
  local_28 = QHttpHeaders::wellKnownHeaderName
                       ((WellKnownHeader)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  local_38 = local_18;
  local_30 = local_10;
  this_02 = local_48;
  pvVar2 = std::data<QByteArrayView>((QByteArrayView *)0x1f239f);
  QtPrivate::lengthHelperContainer<QByteArrayView>((QByteArrayView *)0x1f23b1);
  QAnyStringView::QAnyStringView<char,_true>(this_01,(char *)in_RDI,in_stack_ffffffffffffff00);
  iVar1 = QAnyStringView::compare(local_38,local_30,(CaseSensitivity)local_48[0].d.d.ptr);
  if (iVar1 == 0) {
    (in_RDI->field_0).m_data = (void *)0xaaaaaaaaaaaaaaaa;
    in_RDI->m_size = 0xaaaaaaaaaaaaaaaa;
    in_RDI[1].field_0.m_data = (void *)0xaaaaaaaaaaaaaaaa;
    QByteArray::QByteArray((QByteArray *)0x1f2467);
    local_b0 = (QByteArray *)0x0;
    while (this_00 = local_b0, qVar3 = QHttpHeaders::size(in_stack_fffffffffffffef8),
          (long)this_00 < qVar3) {
      QHttpHeaders::nameAt(this_02,(qsizetype)in_RSI);
      str.m_data = in_RSI;
      str.m_size = (qsizetype)this_01;
      QAnyStringView::QAnyStringView(in_RDI,str);
      iVar1 = QAnyStringView::compare(local_68,local_60,(CaseSensitivity)local_18);
      if (iVar1 == 0) {
        QByteArray::append(this_00,(char *)in_stack_fffffffffffffef8);
        QHttpHeaders::valueAt((QHttpHeaders *)this_01,(qsizetype)in_RDI);
        a.m_data = pvVar2;
        a.m_size = (qsizetype)this_02;
        QByteArray::append((QByteArray *)in_RDI,a);
      }
      local_b0 = (QByteArray *)((long)&(local_b0->d).d + 1);
    }
  }
  else {
    QHttpHeaders::combinedValue(this_02,in_stack_ffffffffffffff40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QByteArray *)this_01;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QNetworkHeadersPrivate::rawHeader(QAnyStringView headerName) const
{
    QByteArrayView setCookieStr = QHttpHeaders::wellKnownHeaderName(
            QHttpHeaders::WellKnownHeader::SetCookie);
    if (QAnyStringView::compare(headerName, setCookieStr, Qt::CaseInsensitive) != 0)
        return httpHeaders.combinedValue(headerName);

    QByteArray result;
    const char* separator = "";
    for (qsizetype i = 0; i < httpHeaders.size(); ++i) {
        if (QAnyStringView::compare(httpHeaders.nameAt(i), headerName, Qt::CaseInsensitive) == 0) {
            result.append(separator);
            result.append(httpHeaders.valueAt(i));
            separator = "\n";
        }
    }
    return result;
}